

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O1

void stbtt__dict_get_ints(stbtt__buf *b,int key,int outcount,stbtt_uint32 *out)

{
  byte *pbVar1;
  uint uVar2;
  bool bVar3;
  stbtt_uint32 sVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uchar *unaff_RBP;
  long lVar9;
  uchar *puVar10;
  byte bVar11;
  long unaff_R12;
  ulong uVar12;
  stbtt__buf operands;
  stbtt__buf local_40;
  
  if (b->size < 0) {
    __assert_fail("!(o > b->size || o < 0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Green-Sky[P]imgui_entt_entity_editor_demo/external/imgui/imstb_truetype.h"
                  ,0x46c,"void stbtt__buf_seek(stbtt__buf *, int)");
  }
  b->cursor = 0;
  do {
    uVar2 = b->cursor;
    iVar7 = b->size;
    if (iVar7 <= (int)uVar2) {
      if (iVar7 < 0) {
        unaff_RBP = (uchar *)0x0;
      }
      else {
        unaff_RBP = b->data;
      }
      unaff_R12 = 0;
      break;
    }
    lVar9 = (long)(int)uVar2;
    puVar10 = b->data;
    bVar3 = true;
    bVar11 = puVar10[lVar9];
    uVar12 = (ulong)uVar2;
    while (uVar5 = (uint)uVar12, 0x1b < bVar11) {
      if (!bVar3) {
        __assert_fail("b0 >= 28",
                      "/workspace/llm4binary/github/license_c_cmakelists/Green-Sky[P]imgui_entt_entity_editor_demo/external/imgui/imstb_truetype.h"
                      ,0x4b1,"void stbtt__cff_skip_operand(stbtt__buf *)");
      }
      if (bVar11 == 0x1e) {
        stbtt__buf_skip(b,1);
        iVar7 = b->cursor;
        lVar9 = (long)iVar7;
        iVar6 = b->size;
        if (b->size < iVar7) {
          iVar6 = iVar7;
        }
        while (iVar7 = iVar7 + 1, iVar6 != lVar9) {
          b->cursor = iVar7;
          pbVar1 = b->data + lVar9;
          if (((~*pbVar1 & 0xf) == 0) || (lVar9 = lVar9 + 1, (*pbVar1 & 0xf0) == 0xf0)) break;
        }
      }
      else {
        stbtt__cff_int(b);
      }
      uVar5 = b->cursor;
      uVar12 = (ulong)uVar5;
      iVar7 = b->size;
      bVar3 = (int)uVar5 < iVar7;
      if (iVar7 <= (int)uVar5) goto LAB_00134e39;
      lVar9 = (long)(int)uVar5;
      puVar10 = b->data;
      bVar11 = puVar10[lVar9];
    }
    if (bVar3) {
      b->cursor = uVar5 + 1;
      bVar11 = puVar10[lVar9];
    }
    else {
LAB_00134e39:
      bVar11 = 0;
    }
    if (bVar11 == 0xc) {
      iVar6 = b->cursor;
      uVar8 = 0x100;
      if (iVar6 < iVar7) {
        b->cursor = iVar6 + 1;
        uVar8 = b->data[iVar6] | 0x100;
      }
    }
    else {
      uVar8 = (uint)bVar11;
    }
    if (uVar8 == key) {
      if (((int)(uVar5 - uVar2 | uVar2) < 0) || (iVar7 < (int)uVar5 || iVar7 < (int)uVar2)) {
        unaff_RBP = (uchar *)0x0;
        unaff_R12 = 0;
      }
      else {
        unaff_RBP = b->data + uVar2;
        unaff_R12 = (ulong)(uVar5 - uVar2) << 0x20;
      }
    }
  } while (uVar8 != key);
  if ((0 < outcount) &&
     (local_40.size = (int)((ulong)unaff_R12 >> 0x20), (int)unaff_R12 < local_40.size)) {
    uVar12 = 1;
    local_40.data = unaff_RBP;
    local_40._8_8_ = unaff_R12;
    do {
      sVar4 = stbtt__cff_int(&local_40);
      out[uVar12 - 1] = sVar4;
      if ((uint)outcount <= uVar12) {
        return;
      }
      uVar12 = uVar12 + 1;
    } while (local_40.cursor < local_40.size);
  }
  return;
}

Assistant:

static void stbtt__dict_get_ints(stbtt__buf *b, int key, int outcount, stbtt_uint32 *out)
{
   int i;
   stbtt__buf operands = stbtt__dict_get(b, key);
   for (i = 0; i < outcount && operands.cursor < operands.size; i++)
      out[i] = stbtt__cff_int(&operands);
}